

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

char * csv_read_one_field(ImportCtx *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int c;
  int iVar5;
  char *pcVar6;
  int iVar7;
  
  while( true ) {
    iVar5 = p->cColSep;
    iVar1 = p->cRowSep;
    p->n = 0;
    iVar3 = fgetc((FILE *)p->in);
    if ((iVar3 == -1) || (seenInterrupt != 0)) {
      p->cTerm = -1;
      return (char *)0x0;
    }
    if (iVar3 == 0x22) break;
    if (((char)iVar3 != -0x11) || (p->bNotFirst != 0)) goto LAB_001e4af8;
    import_append_char(p,iVar3);
    iVar3 = fgetc((FILE *)p->in);
    if ((char)iVar3 != -0x45) goto LAB_001e4af8;
    import_append_char(p,iVar3);
    iVar3 = fgetc((FILE *)p->in);
    if ((char)iVar3 != -0x41) goto LAB_001e4af8;
    p->bNotFirst = 1;
    p->n = 0;
  }
  iVar2 = p->nLine;
  iVar3 = 0;
  iVar7 = 0;
LAB_001e4b52:
  do {
    iVar4 = iVar3;
    c = fgetc((FILE *)p->in);
    if (c == iVar1) {
      p->nLine = p->nLine + 1;
    }
  } while ((iVar4 == 0x22) && (iVar3 = 0, c == 0x22));
  if (((iVar4 == 0x22) && (iVar3 = c, c == iVar5 || c == iVar1)) ||
     (iVar3 = iVar1, (iVar7 == 0x22 && iVar4 == 0xd) && c == iVar1)) {
LAB_001e4c08:
    iVar5 = p->n;
    pcVar6 = p->z + iVar5;
    do {
      iVar5 = iVar5 + -1;
      pcVar6 = pcVar6 + -1;
      p->n = iVar5;
    } while (*pcVar6 != '\"');
    goto LAB_001e4c28;
  }
  if (c == -1 && iVar4 == 0x22) {
    iVar3 = -1;
    goto LAB_001e4c08;
  }
  if (c != 0xd && iVar4 == 0x22) {
    fprintf(_stderr,"%s:%d: unescaped %c character\n",p->zFile,(ulong)(uint)p->nLine,0x22);
  }
  if (c != -1) {
    import_append_char(p,c);
    iVar3 = c;
    iVar7 = iVar4;
    goto LAB_001e4b52;
  }
  fprintf(_stderr,"%s:%d: unterminated %c-quoted field\n",p->zFile,iVar2,0x22);
  iVar3 = -1;
LAB_001e4c28:
  p->cTerm = iVar3;
  if (p->z == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    p->z[p->n] = '\0';
    pcVar6 = p->z;
  }
  p->bNotFirst = 1;
  return pcVar6;
LAB_001e4af8:
  while (((iVar3 != -1 && (iVar3 != iVar5)) && (iVar3 != iVar1))) {
    import_append_char(p,iVar3);
    iVar3 = fgetc((FILE *)p->in);
  }
  if (iVar3 == iVar1) {
    p->nLine = p->nLine + 1;
    iVar5 = p->n;
    if ((0 < (long)iVar5) && (p->z[(long)iVar5 + -1] == '\r')) {
      p->n = iVar5 + -1;
    }
  }
  goto LAB_001e4c28;
}

Assistant:

static char *SQLITE_CDECL csv_read_one_field(ImportCtx *p) {
	int c;
	int cSep = p->cColSep;
	int rSep = p->cRowSep;
	p->n = 0;
	c = fgetc(p->in);
	if (c == EOF || seenInterrupt) {
		p->cTerm = EOF;
		return 0;
	}
	if (c == '"') {
		int pc, ppc;
		int startLine = p->nLine;
		int cQuote = c;
		pc = ppc = 0;
		while (1) {
			c = fgetc(p->in);
			if (c == rSep)
				p->nLine++;
			if (c == cQuote) {
				if (pc == cQuote) {
					pc = 0;
					continue;
				}
			}
			if ((c == cSep && pc == cQuote) || (c == rSep && pc == cQuote) ||
			    (c == rSep && pc == '\r' && ppc == cQuote) || (c == EOF && pc == cQuote)) {
				do {
					p->n--;
				} while (p->z[p->n] != cQuote);
				p->cTerm = c;
				break;
			}
			if (pc == cQuote && c != '\r') {
				utf8_printf(stderr, "%s:%d: unescaped %c character\n", p->zFile, p->nLine, cQuote);
			}
			if (c == EOF) {
				utf8_printf(stderr, "%s:%d: unterminated %c-quoted field\n", p->zFile, startLine, cQuote);
				p->cTerm = c;
				break;
			}
			import_append_char(p, c);
			ppc = pc;
			pc = c;
		}
	} else {
		/* If this is the first field being parsed and it begins with the
		** UTF-8 BOM  (0xEF BB BF) then skip the BOM */
		if ((c & 0xff) == 0xef && p->bNotFirst == 0) {
			import_append_char(p, c);
			c = fgetc(p->in);
			if ((c & 0xff) == 0xbb) {
				import_append_char(p, c);
				c = fgetc(p->in);
				if ((c & 0xff) == 0xbf) {
					p->bNotFirst = 1;
					p->n = 0;
					return csv_read_one_field(p);
				}
			}
		}
		while (c != EOF && c != cSep && c != rSep) {
			import_append_char(p, c);
			c = fgetc(p->in);
		}
		if (c == rSep) {
			p->nLine++;
			if (p->n > 0 && p->z[p->n - 1] == '\r')
				p->n--;
		}
		p->cTerm = c;
	}
	if (p->z)
		p->z[p->n] = 0;
	p->bNotFirst = 1;
	return p->z;
}